

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall HWISim::DigitalWrite(HWISim *this,Pin pin,PinState state)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  string local_38 [8];
  string name;
  PinState local_18;
  Pin local_14;
  PinState state_local;
  Pin pin_local;
  HWISim *this_local;
  
  local_18 = state;
  local_14 = pin;
  _state_local = this;
  pmVar1 = std::
           unordered_map<HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::Pin>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinNames_abi_cxx11_,&local_14);
  std::__cxx11::string::string(local_38,(string *)pmVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"DW (");
  pmVar1 = std::
           unordered_map<HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::Pin>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinNames_abi_cxx11_,&local_14);
  poVar2 = std::operator<<(poVar2,(string *)pmVar1);
  poVar2 = std::operator<<(poVar2,") = ");
  pmVar3 = std::
           unordered_map<HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::PinState>,_std::allocator<std::pair<const_HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinStateNames_abi_cxx11_,&local_18);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DigitalWrite( Pin pin, PinState state ) override
  {
    const std::string name = HWI::pinNames.at(pin);
    std::cout << "DW (" << HWI::pinNames.at(pin) 
              << ") = " << HWI::pinStateNames.at( state ) 
              << "\n";
  }